

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlSetBlendMode(int mode)

{
  int iVar1;
  int mode_local;
  
  iVar1 = RLGL.State.currentBlendMode;
  if (RLGL.State.currentBlendMode != mode) {
    rlDrawRenderBatch(RLGL.currentBatch);
    iVar1 = mode;
    switch(mode) {
    case 0:
      (*glad_glBlendFunc)(0x302,0x303);
      (*glad_glBlendEquation)(0x8006);
      iVar1 = mode;
      break;
    case 1:
      (*glad_glBlendFunc)(0x302,1);
      (*glad_glBlendEquation)(0x8006);
      iVar1 = mode;
      break;
    case 2:
      (*glad_glBlendFunc)(0x306,0x303);
      (*glad_glBlendEquation)(0x8006);
      iVar1 = mode;
      break;
    case 3:
      (*glad_glBlendFunc)(1,1);
      (*glad_glBlendEquation)(0x8006);
      iVar1 = mode;
      break;
    case 4:
      (*glad_glBlendFunc)(1,1);
      (*glad_glBlendEquation)(0x800a);
      iVar1 = mode;
      break;
    case 5:
      (*glad_glBlendFunc)(RLGL.State.glBlendSrcFactor,RLGL.State.glBlendDstFactor);
      (*glad_glBlendEquation)(RLGL.State.glad_glBlendEquation);
      iVar1 = mode;
    }
  }
  RLGL.State.currentBlendMode = iVar1;
  return;
}

Assistant:

void rlSetBlendMode(int mode)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.State.currentBlendMode != mode)
    {
        rlDrawRenderBatch(RLGL.currentBatch);

        switch (mode)
        {
            case BLEND_ALPHA: glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_ADDITIVE: glBlendFunc(GL_SRC_ALPHA, GL_ONE); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_MULTIPLIED: glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_ADD_COLORS: glBlendFunc(GL_ONE, GL_ONE); glBlendEquation(GL_FUNC_ADD); break;
            case BLEND_SUBTRACT_COLORS: glBlendFunc(GL_ONE, GL_ONE); glBlendEquation(GL_FUNC_SUBTRACT); break;
            case BLEND_CUSTOM: glBlendFunc(RLGL.State.glBlendSrcFactor, RLGL.State.glBlendDstFactor); glBlendEquation(RLGL.State.glBlendEquation); break;
            default: break;
        }

        RLGL.State.currentBlendMode = mode;
    }
#endif
}